

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O3

string * deqp::gles3::Performance::strWithWhiteSpaceAndComments
                   (string *__return_storage_ptr__,string *str,deUint32 uniqueNumber)

{
  deUint32 dVar1;
  long *plVar2;
  string *psVar3;
  long *plVar4;
  long *plVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  Random rnd;
  ostringstream s;
  long *local_228;
  long local_218;
  long lStack_210;
  long *local_208;
  long local_200;
  long local_1f8;
  long lStack_1f0;
  long *local_1e8 [2];
  long local_1d8 [2];
  long local_1c8;
  string *local_1c0;
  deRandom local_1b8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  cVar6 = (char)__return_storage_ptr__;
  if ((int)str->_M_string_length < 1) {
    lVar9 = 1;
  }
  else {
    lVar9 = 0;
    do {
      if ((str->_M_dataplus)._M_p[lVar9] == '\n') break;
      std::__cxx11::string::push_back(cVar6);
      lVar9 = lVar9 + 1;
    } while (lVar9 < (int)str->_M_string_length);
    lVar9 = (long)((int)lVar9 + 1);
  }
  std::__cxx11::string::push_back(cVar6);
  deRandom_init(&local_1b8,uniqueNumber);
  local_1c8 = lVar9;
  local_1c0 = str;
  dVar1 = deRandom_getUint32(&local_1b8);
  iVar8 = (dVar1 - (dVar1 / 0xb + (dVar1 / 0xb) * 10)) + 10;
  iVar7 = iVar8;
  do {
    deRandom_getUint32(&local_1b8);
    std::__cxx11::string::push_back(cVar6);
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_1e8,0,(char *)0x0,0xb2cd87);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_1f8 = *plVar4;
    lStack_1f0 = plVar2[3];
    local_208 = &local_1f8;
  }
  else {
    local_1f8 = *plVar4;
    local_208 = (long *)*plVar2;
  }
  local_200 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_208);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_218 = *plVar4;
    lStack_210 = plVar2[3];
    local_228 = &local_218;
  }
  else {
    local_218 = *plVar4;
    local_228 = (long *)*plVar2;
  }
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_228);
  if (local_228 != &local_218) {
    operator_delete(local_228,local_218 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  if (local_1e8[0] != local_1d8) {
    operator_delete(local_1e8[0],local_1d8[0] + 1);
  }
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_1e8,0,(char *)0x0,0xb2cd9f);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_1f8 = *plVar4;
    lStack_1f0 = plVar2[3];
    local_208 = &local_1f8;
  }
  else {
    local_1f8 = *plVar4;
    local_208 = (long *)*plVar2;
  }
  local_200 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_208);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_218 = *plVar4;
    lStack_210 = plVar2[3];
    plVar5 = &local_218;
  }
  else {
    local_218 = *plVar4;
    plVar5 = (long *)*plVar2;
  }
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)plVar5);
  if (plVar5 != &local_218) {
    operator_delete(plVar5,local_218 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  if (local_1e8[0] != local_1d8) {
    operator_delete(local_1e8[0],local_1d8[0] + 1);
  }
  do {
    deRandom_getUint32(&local_1b8);
    std::__cxx11::string::push_back(cVar6);
    iVar8 = iVar8 + -1;
  } while (iVar8 != 0);
  psVar3 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
  return psVar3;
}

Assistant:

static string strWithWhiteSpaceAndComments (const string& str, deUint32 uniqueNumber)
{
	string res("");

	// Find the first newline.
	int firstLineEndNdx = 0;
	while (firstLineEndNdx < (int)str.size() && str[firstLineEndNdx] != '\n')
	{
		res += str[firstLineEndNdx];
		firstLineEndNdx++;
	}
	res += '\n';
	DE_ASSERT(firstLineEndNdx < (int)str.size());

	// Add the whitespaces and comments just after the first line.

	de::Random		rnd		(uniqueNumber);
	int				numWS	= rnd.getInt(10, 20);

	for (int i = 0; i < numWS; i++)
		res += " \t\n"[rnd.getInt(0, 2)];

	res += "/* unique comment " + de::toString(uniqueNumber) + " */\n";
	res += "// unique comment " + de::toString(uniqueNumber) + "\n";

	for (int i = 0; i < numWS; i++)
		res += " \t\n"[rnd.getInt(0, 2)];

	// Add the rest of the string.
	res.append(&str.c_str()[firstLineEndNdx + 1]);

	return res;
}